

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m2v_LU_invmult_inplace(m2v *LU,int rank,int *rowperm,int *inv_colperm,m2v *X_inout)

{
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  int *in_RDI;
  m2v *in_R8;
  m2v Y;
  m2v X;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  m2v local_58;
  m2v local_40;
  m2v *local_28;
  int *local_20;
  int *local_18;
  int local_c;
  int *local_8;
  
  local_c = in_ESI;
  if (in_ESI == -1) {
    if (in_RDI[1] < *in_RDI) {
      in_stack_ffffffffffffffa4 = in_RDI[1];
      local_c = in_stack_ffffffffffffffa4;
    }
    else {
      in_stack_ffffffffffffffa4 = *in_RDI;
      local_c = in_stack_ffffffffffffffa4;
    }
  }
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  m2v_get_subview(&local_40,in_R8,0,0,in_RDI[1],in_R8->n_col);
  m2v_get_subview(&local_58,local_28,0,0,*local_8,local_28->n_col);
  if (local_18 != (int *)0x0) {
    m2v_permute_rows(&local_58,local_18);
  }
  m2v_L_invmult_inplace
            ((m2v *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c,(m2v *)0x1030d8);
  m2v_U_invmult_inplace
            ((m2v *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c,(m2v *)0x1030eb);
  if (local_20 != (int *)0x0) {
    m2v_permute_rows(&local_40,local_20);
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_invmult_inplace)(const MV_GEN_TYPE* LU,
				int rank,
				const int* rowperm,
				const int* inv_colperm,
				MV_GEN_TYPE* X_inout)
{
	/* If the rank is unspecified (-1), we assume the max rank */
	if (rank == -1)
		rank = (LU->n_col < LU->n_row ? LU->n_col : LU->n_row);

	/* Create adequate views */
	assert(LU->n_col <= X_inout->n_row);
	assert(LU->n_row <= X_inout->n_row);
	MV_GEN_TYPE X = MV_GEN_N(_get_subview)(X_inout, 0, 0, LU->n_col, X_inout->n_col);
	MV_GEN_TYPE Y = MV_GEN_N(_get_subview)(X_inout, 0, 0, LU->n_row, X_inout->n_col);

	/* Apply the row permutation */
	if (rowperm != NULL) {
		MV_GEN_N(_permute_rows)(&Y, rowperm);
	}

	MV_GEN_N(_L_invmult_inplace)(LU, rank, &Y);
	MV_GEN_N(_U_invmult_inplace)(LU, rank, &X);

	/* Apply the column permutation */
	if (inv_colperm != NULL) {
		MV_GEN_N(_permute_rows)(&X, inv_colperm);
	}
}